

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest07KeyUsage_::
Section7ValidkeyUsageNotCriticalTest3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section7ValidkeyUsageNotCriticalTest3
          (Section7ValidkeyUsageNotCriticalTest3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest07KeyUsage,
                     Section7ValidkeyUsageNotCriticalTest3) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "keyUsageNotCriticalCACert",
                               "ValidkeyUsageNotCriticalTest3EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "keyUsageNotCriticalCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.7.3";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}